

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestExternalTests.cpp
# Opt level: O3

bool __thiscall
ExternalTester::testGlobalRule
          (ExternalTester *this,BaseFunction *f,TypeOneDRule rule,int *anisotropic,double alpha,
          double beta,vector<TestType,_std::allocator<TestType>_> *tests,int *depths,double *tols)

{
  TypeDepth TVar1;
  pointer pTVar2;
  pointer pTVar3;
  TestType *pTVar4;
  _Base_ptr *pp_Var5;
  _Base_ptr p_Var6;
  bool bVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  TestType *pTVar12;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>
  _Var13;
  size_t sVar14;
  undefined4 extraout_var;
  ostream *poVar15;
  ulong uVar16;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar17;
  pointer pTVar18;
  ulong uVar19;
  int i;
  long lVar20;
  char *pcVar21;
  ulong uVar22;
  size_type sVar23;
  double dVar24;
  TestResults TVar25;
  double local_2f8;
  undefined4 *local_2d0;
  undefined4 local_2c8;
  allocator_type local_2c1;
  double local_2c0;
  vector *local_2b8;
  ExternalTester *local_2b0;
  pointer local_2a8;
  pointer local_2a0;
  ulong local_298;
  double local_290;
  double local_288;
  double local_280;
  TasmanianSparseGrid grid_copy;
  long lStack_270;
  _Base_ptr local_268 [15];
  vector<double,_std::allocator<double>_> x;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
  smap;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_1a0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  vStack_188;
  undefined1 *local_170;
  undefined8 local_168;
  undefined1 local_160;
  undefined7 uStack_15f;
  undefined4 **local_148;
  long lStack_140;
  undefined4 *local_138 [15];
  char *local_c0;
  ulong local_b8;
  TasmanianSparseGrid grid;
  long local_a8;
  
  local_2b0 = this;
  local_290 = alpha;
  local_288 = beta;
  TasGrid::TasmanianSparseGrid::TasmanianSparseGrid(&grid);
  pTVar2 = (tests->super__Vector_base<TestType,_std::allocator<TestType>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar3 = (tests->super__Vector_base<TestType,_std::allocator<TestType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  iVar9 = (**f->_vptr_BaseFunction)(f);
  genRandom(&x,iVar9,1);
  if (rule == rule_fourier) {
    for (lVar20 = 0; iVar9 = (**f->_vptr_BaseFunction)(f), lVar20 < iVar9; lVar20 = lVar20 + 1) {
      x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [lVar20] = (x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar20] + 1.0) * 0.5;
    }
  }
  if (rule == rule_customtabulated) {
    local_2b8 = (vector *)findGaussPattersonTable();
  }
  else {
    local_2b8 = (vector *)0x0;
  }
  pTVar12 = (tests->super__Vector_base<TestType,_std::allocator<TestType>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pTVar4 = (tests->super__Vector_base<TestType,_std::allocator<TestType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar18 = (local_2b0->quad_only).super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)pTVar4 - (long)pTVar12 ==
      (long)(local_2b0->quad_only).super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pTVar18) {
    iVar9 = 0;
    for (; pTVar12 != pTVar4; pTVar12 = pTVar12 + 1) {
      if (*pTVar12 != *pTVar18) goto LAB_0011c6c3;
      pTVar18 = pTVar18 + 1;
    }
  }
  else {
LAB_0011c6c3:
    iVar9 = (*f->_vptr_BaseFunction[1])(f);
  }
  local_298 = (long)pTVar3 - (long)pTVar2;
  uVar17 = (long)local_298 >> 2;
  local_2a8 = pTVar3;
  local_2a0 = pTVar2;
  if (pTVar3 == pTVar2) {
    bVar7 = true;
  }
  else {
    local_c0 = "global";
    if (rule == rule_fourier) {
      local_c0 = "fourier";
    }
    local_b8 = (ulong)(rule == rule_fourier) | 6;
    local_280 = (double)(uVar17 + (uVar17 == 0));
    bVar7 = true;
    dVar24 = 0.0;
    do {
      if (rule == rule_fourier) {
        if (anisotropic == (int *)0x0) {
          iVar10 = (**f->_vptr_BaseFunction)();
          TVar1 = depths[(long)dVar24];
          local_268[0] = (_Base_ptr)0x0;
          _grid_copy = (_Base_ptr *)0x0;
          lStack_270 = 0;
          local_138[0] = (undefined4 *)0x0;
          local_148 = (undefined4 **)0x0;
          lStack_140 = 0;
          TasGrid::TasmanianSparseGrid::TasmanianSparseGrid((TasmanianSparseGrid *)&smap);
          TasGrid::TasmanianSparseGrid::makeFourierGrid
                    ((int)(TasmanianSparseGrid *)&smap,iVar10,iVar9,TVar1,(vector *)0x1,
                     (vector *)&grid_copy);
          TasGrid::TasmanianSparseGrid::operator=(&grid,(TasmanianSparseGrid *)&smap);
          TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid((TasmanianSparseGrid *)&smap);
          if (local_148 != (undefined4 **)0x0) {
            operator_delete(local_148,(long)local_138[0] - (long)local_148);
          }
          if (_grid_copy != (_Base_ptr *)0x0) {
            operator_delete(_grid_copy,(long)local_268[0] - (long)_grid_copy);
          }
        }
        else {
          iVar10 = (**f->_vptr_BaseFunction)();
          TasGrid::TasmanianSparseGrid::makeFourierGrid
                    ((int)&grid,iVar10,iVar9,depths[(long)dVar24],(int *)0x1,anisotropic);
        }
        if (local_a8 == 0) {
          sVar23 = 0;
        }
        else {
          sVar23 = (size_type)*(int *)(local_a8 + 0x10);
        }
        local_148 = (undefined4 **)0xbff0000000000000;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&smap,sVar23,
                   (value_type_conflict1 *)&local_148,(allocator_type *)&local_2c8);
        if (local_a8 == 0) {
          sVar23 = 0;
        }
        else {
          sVar23 = (size_type)*(int *)(local_a8 + 0x10);
        }
        local_2d0 = (undefined4 *)0x3ff0000000000000;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&grid_copy,sVar23,
                   (value_type_conflict1 *)&local_2d0,&local_2c1);
        TasGrid::TasmanianSparseGrid::setDomainTransform((vector *)&grid,(vector *)&smap);
        pp_Var5 = (_Base_ptr *)smap._M_t._M_impl._0_8_;
        p_Var6 = smap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (_grid_copy != (_Base_ptr *)0x0) {
          operator_delete(_grid_copy,(long)local_268[0] - (long)_grid_copy);
          pp_Var5 = (_Base_ptr *)smap._M_t._M_impl._0_8_;
          p_Var6 = smap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        }
joined_r0x0011c9e2:
        if (pp_Var5 != (_Base_ptr *)0x0) {
          operator_delete(pp_Var5,(long)p_Var6 - (long)pp_Var5);
        }
      }
      else {
        if (anisotropic == (int *)0x0) {
          iVar10 = (**f->_vptr_BaseFunction)();
          TVar1 = depths[(long)dVar24];
          local_268[0] = (_Base_ptr)0x0;
          _grid_copy = (_Base_ptr *)0x0;
          lStack_270 = 0;
          local_138[0] = (undefined4 *)0x0;
          local_148 = (undefined4 **)0x0;
          lStack_140 = 0;
          TasGrid::TasmanianSparseGrid::TasmanianSparseGrid((TasmanianSparseGrid *)&smap);
          TasGrid::TasmanianSparseGrid::makeGlobalGrid
                    ((int)(TasmanianSparseGrid *)&smap,iVar10,iVar9,TVar1,rule_chebyshev,
                     (vector *)(ulong)rule,local_290,local_288,(char *)&grid_copy,local_2b8);
          TasGrid::TasmanianSparseGrid::operator=(&grid,(TasmanianSparseGrid *)&smap);
          TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid((TasmanianSparseGrid *)&smap);
          pp_Var5 = _grid_copy;
          p_Var6 = local_268[0];
          if (local_148 != (undefined4 **)0x0) {
            operator_delete(local_148,(long)local_138[0] - (long)local_148);
            pp_Var5 = _grid_copy;
            p_Var6 = local_268[0];
          }
          goto joined_r0x0011c9e2;
        }
        iVar10 = (**f->_vptr_BaseFunction)();
        TasGrid::TasmanianSparseGrid::makeGlobalGrid
                  ((int)&grid,iVar10,iVar9,depths[(long)dVar24],rule_chebyshev,(int *)(ulong)rule,
                   local_290,local_288,(char *)anisotropic,(int *)local_2b8);
      }
      TVar25 = getError(local_2b0,f,&grid,
                        (tests->super__Vector_base<TestType,_std::allocator<TestType>_>)._M_impl.
                        super__Vector_impl_data._M_start[(long)dVar24],&x);
      local_2c0 = TVar25.error;
      if (tols[(long)dVar24] <= local_2c0 && local_2c0 != tols[(long)dVar24]) {
        *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0x12
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ERROR: FAILED ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_c0,local_b8);
        *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0x19
        ;
        local_2d0 = (undefined4 *)CONCAT44(local_2d0._4_4_,rule);
        TasGrid::IO::getStringRuleMap_abi_cxx11_();
        local_148 = &local_2d0;
        _Var13._M_node = smap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while (((_Rb_tree_header *)_Var13._M_node != &smap._M_t._M_impl.super__Rb_tree_header &&
               (bVar7 = __gnu_cxx::__ops::
                        _Iter_pred<TasGrid::IO::getRuleString[abi:cxx11](TasGrid::TypeOneDRule)::{lambda(std::pair<std::__cxx11::string,TasGrid::TypeOneDRule>)#1}>
                        ::operator()((_Iter_pred<TasGrid::IO::getRuleString[abi:cxx11](TasGrid::TypeOneDRule)::_lambda(std::pair<std::__cxx11::string,TasGrid::TypeOneDRule>)_1_>
                                      *)&local_148,_Var13), !bVar7))) {
          _Var13._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var13._M_node);
        }
        _grid_copy = local_268;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&grid_copy,*(long *)(_Var13._M_node + 1),
                   (long)&(_Var13._M_node[1]._M_parent)->_M_color + *(long *)(_Var13._M_node + 1));
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
        ::~_Rb_tree(&smap._M_t);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)_grid_copy,lStack_270);
        if (_grid_copy != local_268) {
          operator_delete(_grid_copy,(ulong)((long)&local_268[0]->_M_color + 1));
        }
        *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0x19
        ;
        uVar22 = (ulong)(tests->super__Vector_base<TestType,_std::allocator<TestType>_>)._M_impl.
                        super__Vector_impl_data._M_start[(long)dVar24];
        pcVar21 = "unknown test";
        if (uVar22 < 5) {
          pcVar21 = (&PTR_anon_var_dwarf_32c83_001520c8)[uVar22];
        }
        sVar14 = strlen(pcVar21);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar21,sVar14);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"   failed function: ",0x14);
        iVar10 = (*f->_vptr_BaseFunction[2])();
        pcVar21 = (char *)CONCAT44(extraout_var,iVar10);
        if (pcVar21 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x154430);
        }
        else {
          sVar14 = strlen(pcVar21);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar21,sVar14);
        }
        *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 10;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  observed: ",0xc)
        ;
        poVar15 = std::ostream::_M_insert<double>(local_2c0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,"  expected: ",0xc);
        poVar15 = std::ostream::_M_insert<double>(tols[(long)dVar24]);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
        std::ostream::put((char)poVar15);
        std::ostream::flush();
        bVar7 = false;
      }
      dVar24 = (double)((long)dVar24 + 1);
    } while (dVar24 != local_280);
  }
  local_2c0 = (double)CONCAT44(local_2c0._4_4_,(uint)(rule != rule_fourier) * 3 + 1);
  if (rule == rule_customtabulated) {
    TasGrid::TasmanianSparseGrid::TasmanianSparseGrid(&grid_copy);
    if (local_2a8 != local_2a0) {
      local_298 = ((long)local_298 >> 1) + (ulong)((long)local_298 >> 1 == 0);
      uVar22 = 0;
      do {
        if (uVar22 < uVar17) {
          iVar10 = (**f->_vptr_BaseFunction)();
          TasGrid::TasmanianSparseGrid::makeGlobalGrid
                    ((int)&grid,iVar10,iVar9,depths[uVar22],local_2c0._0_4_,(int *)0x24,local_290,
                     local_288,(char *)anisotropic,(int *)local_2b8);
        }
        else {
          smap._M_t._M_impl._0_8_ = smap._M_t._M_impl._0_8_ & 0xffffffff00000000;
          vStack_188.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_188.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_1a0.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vStack_188.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1a0.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1a0.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          smap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          smap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
          smap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
          smap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          smap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          smap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_170 = &local_160;
          local_168 = 0;
          local_160 = 0;
          TasGrid::CustomTabulated::read((char *)&smap);
          TasGrid::TasmanianSparseGrid::TasmanianSparseGrid((TasmanianSparseGrid *)&local_148);
          TasGrid::TasmanianSparseGrid::operator=(&grid,(TasmanianSparseGrid *)&local_148);
          TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid((TasmanianSparseGrid *)&local_148);
          iVar10 = (**f->_vptr_BaseFunction)();
          TasGrid::TasmanianSparseGrid::makeGlobalGrid
                    ((int)&grid,iVar10,iVar9,depths[uVar22 % uVar17],
                     (CustomTabulated *)((ulong)local_2c0 & 0xffffffff),(int *)&smap,anisotropic);
          if (local_170 != &local_160) {
            operator_delete(local_170,CONCAT71(uStack_15f,local_160) + 1);
          }
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::~vector(&vStack_188);
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::~vector(&local_1a0);
          if (smap._M_t._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0) {
            operator_delete(smap._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
                            -(long)smap._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
          }
          if (smap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
            operator_delete((void *)smap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
                            (long)smap._M_t._M_impl.super__Rb_tree_header._M_header._M_left -
                            smap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
          }
        }
        TasGrid::TasmanianSparseGrid::operator=(&grid_copy,&grid);
        uVar19 = uVar22 % uVar17;
        TVar25 = getError(local_2b0,f,&grid_copy,
                          (tests->super__Vector_base<TestType,_std::allocator<TestType>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar19],&x);
        local_280 = TVar25.error;
        if (tols[uVar19] <= local_280 && local_280 != tols[uVar19]) {
          *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) =
               0x12;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"ERROR: FAILED global",0x14);
          *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) =
               0x19;
          local_2c8 = 0x24;
          TasGrid::IO::getStringRuleMap_abi_cxx11_();
          local_2d0 = &local_2c8;
          _Var13._M_node = smap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          while (((_Rb_tree_header *)_Var13._M_node != &smap._M_t._M_impl.super__Rb_tree_header &&
                 (bVar7 = __gnu_cxx::__ops::
                          _Iter_pred<TasGrid::IO::getRuleString[abi:cxx11](TasGrid::TypeOneDRule)::{lambda(std::pair<std::__cxx11::string,TasGrid::TypeOneDRule>)#1}>
                          ::operator()((_Iter_pred<TasGrid::IO::getRuleString[abi:cxx11](TasGrid::TypeOneDRule)::_lambda(std::pair<std::__cxx11::string,TasGrid::TypeOneDRule>)_1_>
                                        *)&local_2d0,_Var13), !bVar7))) {
            _Var13._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var13._M_node);
          }
          local_148 = local_138;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,*(long *)(_Var13._M_node + 1),
                     (long)&(_Var13._M_node[1]._M_parent)->_M_color + *(long *)(_Var13._M_node + 1))
          ;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
          ::~_Rb_tree(&smap._M_t);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)local_148,lStack_140);
          if (local_148 != local_138) {
            operator_delete(local_148,(long)local_138[0] + 1);
          }
          *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) =
               0x19;
          uVar16 = (ulong)(tests->super__Vector_base<TestType,_std::allocator<TestType>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar19];
          pcVar21 = "unknown test";
          if (uVar16 < 5) {
            pcVar21 = (&PTR_anon_var_dwarf_32c83_001520c8)[uVar16];
          }
          sVar14 = strlen(pcVar21);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar21,sVar14);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"   failed function: ",0x14);
          iVar10 = (*f->_vptr_BaseFunction[2])();
          pcVar21 = (char *)CONCAT44(extraout_var_00,iVar10);
          if (pcVar21 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x154430);
          }
          else {
            sVar14 = strlen(pcVar21);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar21,sVar14)
            ;
          }
          *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 10
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"observed: ",10);
          poVar15 = std::ostream::_M_insert<double>(local_280);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,"  expected: ",0xc);
          poVar15 = std::ostream::_M_insert<double>(tols[uVar19]);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
          std::ostream::put((char)poVar15);
          std::ostream::flush();
          bVar7 = false;
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 != local_298);
    }
    TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid(&grid_copy);
  }
  pTVar3 = local_2a0;
  pTVar2 = local_2a8;
  bVar8 = TasGrid::OneDimensionalMeta::isSequence(rule);
  if ((bVar8 & pTVar2 != pTVar3) == 1) {
    lVar20 = 0;
    do {
      if ((tests->super__Vector_base<TestType,_std::allocator<TestType>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar20] == type_integration) {
        iVar9 = (**f->_vptr_BaseFunction)();
        TasGrid::TasmanianSparseGrid::makeSequenceGrid
                  ((int)&grid,iVar9,0,depths[lVar20],local_2c0._0_4_,(int *)(ulong)rule,anisotropic)
        ;
        smap._M_t._M_impl._0_8_ = 0;
        smap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        smap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        smap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        TVar25 = getError(local_2b0,f,&grid,type_integration,
                          (vector<double,_std::allocator<double>_> *)&smap);
        local_2f8 = TVar25.error;
        if (smap._M_t._M_impl._0_8_ != 0) {
          operator_delete((void *)smap._M_t._M_impl._0_8_,
                          (long)smap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent -
                          smap._M_t._M_impl._0_8_);
        }
      }
      else {
        iVar9 = (**f->_vptr_BaseFunction)(f);
        iVar10 = (*f->_vptr_BaseFunction[1])(f);
        TVar1 = depths[lVar20];
        if (anisotropic == (int *)0x0) {
          _grid_copy = (_Base_ptr *)0x0;
          lStack_270 = 0;
          local_268[0] = (_Base_ptr)0x0;
        }
        else {
          iVar11 = (**f->_vptr_BaseFunction)();
          std::vector<int,std::allocator<int>>::vector<int_const*,void>
                    ((vector<int,std::allocator<int>> *)&grid_copy,anisotropic,anisotropic + iVar11,
                     (allocator_type *)&local_2c8);
        }
        local_148 = (undefined4 **)0x0;
        lStack_140 = 0;
        local_138[0] = (undefined4 *)0x0;
        TasGrid::TasmanianSparseGrid::TasmanianSparseGrid((TasmanianSparseGrid *)&smap);
        TasGrid::TasmanianSparseGrid::makeSequenceGrid
                  ((int)(TasmanianSparseGrid *)&smap,iVar9,iVar10,TVar1,local_2c0._0_4_,
                   (vector *)(ulong)rule,(vector *)&grid_copy);
        TasGrid::TasmanianSparseGrid::operator=(&grid,(TasmanianSparseGrid *)&smap);
        TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid((TasmanianSparseGrid *)&smap);
        if (local_148 != (undefined4 **)0x0) {
          operator_delete(local_148,(long)local_138[0] - (long)local_148);
        }
        if (_grid_copy != (_Base_ptr *)0x0) {
          operator_delete(_grid_copy,(long)local_268[0] - (long)_grid_copy);
        }
        TVar25 = getError(local_2b0,f,&grid,
                          (tests->super__Vector_base<TestType,_std::allocator<TestType>_>)._M_impl.
                          super__Vector_impl_data._M_start[lVar20],&x);
        local_2f8 = TVar25.error;
      }
      if (tols[lVar20] <= local_2f8 && local_2f8 != tols[lVar20]) {
        *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0x12
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ERROR: FAILED sequence",0x16);
        *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0x19
        ;
        local_2d0 = (undefined4 *)CONCAT44(local_2d0._4_4_,rule);
        TasGrid::IO::getStringRuleMap_abi_cxx11_();
        local_148 = &local_2d0;
        _Var13._M_node = smap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while (((_Rb_tree_header *)_Var13._M_node != &smap._M_t._M_impl.super__Rb_tree_header &&
               (bVar7 = __gnu_cxx::__ops::
                        _Iter_pred<TasGrid::IO::getRuleString[abi:cxx11](TasGrid::TypeOneDRule)::{lambda(std::pair<std::__cxx11::string,TasGrid::TypeOneDRule>)#1}>
                        ::operator()((_Iter_pred<TasGrid::IO::getRuleString[abi:cxx11](TasGrid::TypeOneDRule)::_lambda(std::pair<std::__cxx11::string,TasGrid::TypeOneDRule>)_1_>
                                      *)&local_148,_Var13), !bVar7))) {
          _Var13._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var13._M_node);
        }
        _grid_copy = local_268;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&grid_copy,*(long *)(_Var13._M_node + 1),
                   (long)&(_Var13._M_node[1]._M_parent)->_M_color + *(long *)(_Var13._M_node + 1));
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeOneDRule>_>_>
                     *)&smap);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)_grid_copy,lStack_270);
        if (_grid_copy != local_268) {
          operator_delete(_grid_copy,(ulong)((long)&local_268[0]->_M_color + 1));
        }
        *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 0x19
        ;
        uVar22 = (ulong)(tests->super__Vector_base<TestType,_std::allocator<TestType>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar20];
        pcVar21 = "unknown test";
        if (uVar22 < 5) {
          pcVar21 = (&PTR_anon_var_dwarf_32c83_001520c8)[uVar22];
        }
        sVar14 = strlen(pcVar21);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar21,sVar14);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"   failed function: ",0x14);
        iVar9 = (*f->_vptr_BaseFunction[2])();
        pcVar21 = (char *)CONCAT44(extraout_var_01,iVar9);
        if (pcVar21 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x154430);
        }
        else {
          sVar14 = strlen(pcVar21);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar21,sVar14);
        }
        *(undefined8 *)(TasGrid::OneDimensionalMeta::isGlobal + *(long *)(std::cout + -0x18)) = 10;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  observed: ",0xc)
        ;
        poVar15 = std::ostream::_M_insert<double>(local_2f8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,"  expected: ",0xc);
        poVar15 = std::ostream::_M_insert<double>(tols[lVar20]);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
        std::ostream::put((char)poVar15);
        std::ostream::flush();
        bVar7 = false;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != uVar17 + (uVar17 == 0));
  }
  if (x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid(&grid);
  return bVar7;
}

Assistant:

bool ExternalTester::testGlobalRule(const BaseFunction *f, TasGrid::TypeOneDRule rule, const int *anisotropic, double alpha, double beta, const std::vector<TestType> &tests, const int depths[], const double tols[]) const{
    TasGrid::TasmanianSparseGrid grid;
    TestResults R;
    size_t num_global_tests = tests.size();
    TasGrid::TypeDepth type = (rule == rule_fourier ? TasGrid::type_level : TasGrid::type_iptotal);
    std::vector<double> x = genRandom(f->getNumInputs());
    if (rule == rule_fourier){ for(int i=0; i<f->getNumInputs(); i++) x[i] = 0.5*(x[i]+1.0); }    // map to canonical [0,1]^d
    bool bPass = true;
    const char *custom_filename = (rule == rule_customtabulated) ? findGaussPattersonTable() : 0;
    int num_fn_outputs = (tests == quad_only) ? 0 : f->getNumOutputs();
    for(size_t i=0; i<num_global_tests; i++){
        if (rule == rule_fourier){
            if (anisotropic == nullptr){
                grid = makeFourierGrid(f->getNumInputs(), num_fn_outputs, depths[i], type);
            }else{
                grid.makeFourierGrid(f->getNumInputs(), num_fn_outputs, depths[i], type, anisotropic);
            }
            grid.setDomainTransform(std::vector<double>(grid.getNumDimensions(), -1.0), std::vector<double>(grid.getNumDimensions(), 1.0));
        }else{
            if (anisotropic == nullptr){
                grid = makeGlobalGrid(f->getNumInputs(), num_fn_outputs, depths[i], type, rule, std::vector<int>(), alpha, beta, custom_filename);
            }else{
                grid.makeGlobalGrid(f->getNumInputs(), num_fn_outputs, depths[i], type, rule, anisotropic, alpha, beta, custom_filename);
            }
        }
        R = getError(f, grid, tests[i], x);
        if (R.error > tols[i]){
            bPass = false;
            cout << setw(18) << "ERROR: FAILED " << (rule == rule_fourier ? "fourier" : "global") << setw(25) << IO::getRuleString(rule);
            cout << setw(25) << testName(tests[i]) << "   failed function: " << f->getDescription();
            cout << setw(10) << "  observed: " << R.error << "  expected: " << tols[i] << endl;
        }
    }
    if (rule == rule_customtabulated){
        TasGrid::TasmanianSparseGrid grid_copy;
        for(size_t i=0; i<2*num_global_tests; i++){
            if (i < num_global_tests){
                grid.makeGlobalGrid(f->getNumInputs(), num_fn_outputs, depths[i], type, rule, anisotropic, alpha, beta, custom_filename);
            }else{
                CustomTabulated custom;
                custom.read(custom_filename);
                grid = TasmanianSparseGrid();
                grid.makeGlobalGrid(f->getNumInputs(), num_fn_outputs, depths[i % num_global_tests], type, std::move(custom), anisotropic);
            }
            grid_copy = grid;
            R = getError(f, grid_copy, tests[i % num_global_tests], x);
            if (R.error > tols[i % num_global_tests]){
                bPass = false;
                cout << setw(18) << "ERROR: FAILED global" << setw(25) << IO::getRuleString(rule);
                cout << setw(25) << testName(tests[i % num_global_tests]) << "   failed function: " << f->getDescription();
                cout << setw(10) << "observed: " << R.error << "  expected: " << tols[i % num_global_tests] << endl;
            }
        }
    }

    if (TasGrid::OneDimensionalMeta::isSequence(rule)){
        for(size_t i=0; i<num_global_tests; i++){
            if (tests[i] == type_integration){
                grid.makeSequenceGrid(f->getNumInputs(), 0, depths[i], type, rule, anisotropic);
                R = getError(f, grid, type_integration);
            }else{
                grid = makeSequenceGrid(f->getNumInputs(), f->getNumOutputs(), depths[i], type, rule,
                                        (anisotropic != nullptr) ? std::vector<int>(anisotropic, anisotropic + f->getNumInputs()) : std::vector<int>());
                R = getError(f, grid, tests[i], x);
            }
            if (R.error > tols[i]){
                bPass = false;
                cout << setw(18) << "ERROR: FAILED sequence" << setw(25) << IO::getRuleString(rule);
                cout << setw(25) << testName(tests[i]) << "   failed function: " << f->getDescription();
                cout << setw(10) << "  observed: " << R.error << "  expected: " << tols[i] << endl;
            }
        }
    }
    return bPass;
}